

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O0

void __thiscall QBlitterPaintEngine::fillRect(QBlitterPaintEngine *this,QRectF *rect,QColor *color)

{
  bool bVar1;
  int iVar2;
  QBlitterPaintEnginePrivate *this_00;
  QColor *in_RDX;
  QRectF *in_RSI;
  QColor *in_RDI;
  QBlitterPaintEnginePrivate *d;
  bool in_stack_00000087;
  QColor *in_stack_00000088;
  QRectF *in_stack_00000090;
  QBlitterPaintEnginePrivate *in_stack_00000098;
  QColor *this_01;
  
  this_01 = in_RDI;
  this_00 = d_func((QBlitterPaintEngine *)0x55c145);
  bVar1 = CapabilitiesToStateMask::canBlitterAlphaFillRect((CapabilitiesToStateMask *)0x55c15b);
  if (bVar1) {
    QBlitterPaintEnginePrivate::fillRect
              (in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000087);
  }
  else {
    bVar1 = CapabilitiesToStateMask::canBlitterFillRect((CapabilitiesToStateMask *)0x55c18d);
    if ((bVar1) && (iVar2 = QColor::alpha(in_RDI), iVar2 == 0xff)) {
      QBlitterPaintEnginePrivate::fillRect
                (in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000087);
    }
    else {
      QBlitterPaintEnginePrivate::lock(this_00);
      QBlittablePlatformPixmap::markRasterOverlay(this_00->pmData,in_RSI);
      QRasterPaintEngine::fillRect((QRasterPaintEngine *)this_01,in_RSI,in_RDX);
    }
  }
  return;
}

Assistant:

void QBlitterPaintEngine::fillRect(const QRectF &rect, const QColor &color)
{
    Q_D(QBlitterPaintEngine);
    if (d->caps.canBlitterAlphaFillRect()) {
        d->fillRect(rect, color, true);
    } else if (d->caps.canBlitterFillRect() && color.alpha() == 0xff) {
        d->fillRect(rect, color, false);
    } else {
        d->lock();
        d->pmData->markRasterOverlay(rect);
        QRasterPaintEngine::fillRect(rect, color);
    }
}